

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O1

void __thiscall
TEST_WiningStateTest_DoubleReady_Test::~TEST_WiningStateTest_DoubleReady_Test
          (TEST_WiningStateTest_DoubleReady_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupWiningStateTest_001dd920;
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).s.bonus_tiles._M_t);
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector
            (&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.melds);
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).h.tiles._M_t);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST(WiningStateTest, DoubleReady)
{
	addNoWiningHand();

	h.doubleReady();
	winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleReady));
	CHECK_EQUAL(2, r.doubling_factor);
}